

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtable.cpp
# Opt level: O0

void __thiscall FStringTable::FreeNonDehackedStrings(FStringTable *this)

{
  StringEntry *pSVar1;
  StringEntry *local_30;
  StringEntry **pentry;
  StringEntry *next;
  StringEntry *entry;
  int i;
  FStringTable *this_local;
  
  for (entry._4_4_ = 0; entry._4_4_ < 0x80; entry._4_4_ = entry._4_4_ + 1) {
    local_30 = (StringEntry *)(this->Buckets + entry._4_4_);
    next = local_30->Next;
    while (next != (StringEntry *)0x0) {
      pSVar1 = next->Next;
      if (next->PassNum == '\0') {
        local_30 = next;
        next = pSVar1;
      }
      else {
        local_30->Next = pSVar1;
        M_Free(next);
        next = pSVar1;
      }
    }
  }
  return;
}

Assistant:

void FStringTable::FreeNonDehackedStrings ()
{
	for (int i = 0; i < HASH_SIZE; ++i)
	{
		StringEntry *entry, *next, **pentry;

		for (pentry = &Buckets[i], entry = *pentry; entry != NULL; )
		{
			next = entry->Next;
			if (entry->PassNum != 0)
			{
				*pentry = next;
				M_Free (entry);
			}
			else
			{
				pentry = &entry->Next;
			}
			entry = next;
		}
	}
}